

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

int64_t GetFileSize(string *filename)

{
  int iVar1;
  char *pcVar2;
  string *local_b8;
  uint64_t devsize;
  undefined1 local_a8 [4];
  int h;
  stat st;
  string *filename_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)filename;
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (filename);
  iVar1 = stat(pcVar2,(stat *)local_a8);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0x8000) == 0) {
      if (((uint)st.st_nlink & 0x6000) == 0) {
        printf("could not get size for device\n");
        filename_local = (string *)0xffffffffffffffff;
      }
      else {
        pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       st.__glibc_reserved[2]);
        devsize._4_4_ = open(pcVar2,0);
        iVar1 = ioctl(devsize._4_4_,0x80081272,&local_b8);
        if (iVar1 == -1) {
          close(devsize._4_4_);
          print<>("ERROR: ioctl(BLKGETSIZE64)");
          filename_local = (string *)0xffffffffffffffff;
        }
        else {
          close(devsize._4_4_);
          filename_local = local_b8;
        }
      }
    }
    else {
      filename_local = (string *)st.st_rdev;
    }
  }
  else {
    print<>("ERROR: stat");
    filename_local = (string *)0xffffffffffffffff;
  }
  return (int64_t)filename_local;
}

Assistant:

int64_t GetFileSize(const std::string& filename)
{
#ifdef WIN32
    HANDLE hSrc = CreateFile(filename.c_str(), GENERIC_READ, FILE_SHARE_WRITE|FILE_SHARE_READ,
                NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (INVALID_HANDLE_VALUE == hSrc)
    {
        print("ERROR: Unable to open file %s", filename.c_str());
        return -1;
    }

    DWORD dwSizeH;
    DWORD dwSizeL= GetFileSize(hSrc, &dwSizeH);

    CloseHandle(hSrc);

    return ((int64_t)dwSizeH<<32)+dwSizeL;
#else
    struct stat st;
    if (stat(filename.c_str(), &st)) {
        print("ERROR: stat");
        return -1;
    }
    if (st.st_mode&S_IFREG)
        return st.st_size;
    else if (st.st_mode&S_IFBLK) {
        int h= open(filename.c_str(), O_RDONLY);
        uint64_t devsize;
#ifdef DKIOCGETBLOCKCOUNT
        uint64_t bkcount;
        uint32_t bksize;
        if (-1==ioctl(h, DKIOCGETBLOCKCOUNT, &bkcount)) {
            close(h);
            print("ERROR: ioctl(DKIOCGETBLOCKCOUNT)");
            return -1;
        }
        if (-1==ioctl(h, DKIOCGETBLOCKSIZE, &bksize)) {
            close(h);
            print("ERROR: ioctl(DKIOCGETBLOCKSIZE)");
            return -1;
        }
        devsize = bkcount*bksize;
#endif
#ifdef BLKGETSIZE64
        if (-1==ioctl(h, BLKGETSIZE64, &devsize)) {
            close(h);
            print("ERROR: ioctl(BLKGETSIZE64)");
            return -1;
        }
#endif
        close(h);
        return devsize;
    }
    else {
        printf("could not get size for device\n");
        return -1;
    }
#endif
}